

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_randomize(Integer g_a,void *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Integer IVar4;
  long lVar5;
  double *in_RSI;
  Integer in_RDI;
  Integer I_elems;
  Integer grp_me;
  char err_string_1 [256];
  char err_string [256];
  Integer num_blocks;
  Integer grp_id;
  C_Long elems;
  int local_sync_end;
  int local_sync_begin;
  char *ptr;
  int handle;
  int i;
  double in_stack_fffffffffffffd60;
  Integer *in_stack_fffffffffffffd88;
  double dVar6;
  undefined4 in_stack_fffffffffffffd90;
  float fVar7;
  undefined4 in_stack_fffffffffffffd94;
  Integer in_stack_fffffffffffffd98;
  Integer in_stack_fffffffffffffda0;
  char local_248 [256];
  char local_148 [64];
  Integer in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *local_20;
  int local_14;
  
  iVar1 = _ga_sync_end;
  iVar3 = _ga_sync_begin;
  iVar2 = (int)in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  IVar4 = pnga_get_pgroup(in_RDI);
  if (iVar3 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd60);
  }
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_148,"%s: INVALID ARRAY HANDLE","ga_randomize");
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(local_248,"%s: ARRAY NOT ACTIVE","ga_randomize");
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if (((GA[iVar2].type < 1000) || (0x4e7 < GA[iVar2].type)) ||
     (ga_types[GA[iVar2].type + -1000].active == 0)) {
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  lVar5 = GA[iVar2].size / (long)GA[iVar2].elemsize;
  if (GA[iVar2].block_total < 0) {
    if (IVar4 < 0) {
      local_20 = GA[iVar2].ptr[GAme];
    }
    else {
      local_20 = GA[iVar2].ptr[PGRP_LIST[GA[iVar2].p_handle].map_proc_list[GAme]];
    }
    switch(GA[iVar2].type) {
    case 0x3e9:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        fVar7 = *(float *)in_RSI;
        iVar3 = rand();
        *(int *)(local_20 + (long)local_14 * 4) = ((int)fVar7 * iVar3) / 0x7fffffff;
      }
      break;
    case 0x3ea:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        dVar6 = *in_RSI;
        iVar3 = rand();
        *(long *)(local_20 + (long)local_14 * 8) = ((long)dVar6 * (long)iVar3) / 0x7fffffff;
      }
      break;
    case 0x3eb:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        fVar7 = *(float *)in_RSI;
        iVar3 = rand();
        *(float *)(local_20 + (long)local_14 * 4) = (fVar7 * (float)iVar3) / 2.1474836e+09;
      }
      break;
    case 0x3ec:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        dVar6 = *in_RSI;
        iVar3 = rand();
        *(double *)(local_20 + (long)local_14 * 8) = (dVar6 * (double)iVar3) / 2147483647.0;
      }
      break;
    default:
      pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      break;
    case 0x3f8:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        dVar6 = *in_RSI;
        iVar3 = rand();
        *(long *)(local_20 + (long)local_14 * 8) = ((long)dVar6 * (long)iVar3) / 0x7fffffff;
      }
    }
  }
  else {
    pnga_access_block_segment_ptr
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (void *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    switch(GA[iVar2].type) {
    case 0x3e9:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        fVar7 = *(float *)in_RSI;
        iVar3 = rand();
        *(int *)((long)local_20 + (long)local_14 * 4) = ((int)fVar7 * iVar3) / 0x7fffffff;
      }
      break;
    case 0x3ea:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        in_stack_fffffffffffffd60 = *in_RSI;
        iVar3 = rand();
        *(long *)((long)local_20 + (long)local_14 * 8) =
             ((long)in_stack_fffffffffffffd60 * (long)iVar3) / 0x7fffffff;
      }
      break;
    case 0x3eb:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        fVar7 = *(float *)in_RSI;
        iVar3 = rand();
        *(float *)((long)local_20 + (long)local_14 * 4) = (fVar7 * (float)iVar3) / 2.1474836e+09;
      }
      break;
    case 0x3ec:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        dVar6 = *in_RSI;
        iVar3 = rand();
        *(double *)((long)local_20 + (long)local_14 * 8) = (dVar6 * (double)iVar3) / 2147483647.0;
      }
      break;
    default:
      pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      break;
    case 0x3f8:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        dVar6 = *in_RSI;
        iVar3 = rand();
        *(long *)((long)local_20 + (long)local_14 * 8) = ((long)dVar6 * (long)iVar3) / 0x7fffffff;
      }
    }
    pnga_release_block_segment(in_RDI,GAme);
  }
  if (iVar1 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

void pnga_randomize(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_randomize");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*) rand();
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*) val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*) val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*) val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*) val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*) val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}